

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O0

string_stream * __thiscall
argh::parser::operator()
          (string_stream *__return_storage_ptr__,parser *this,string *name,char (*def_val) [2])

{
  bool bVar1;
  pointer ppVar2;
  string local_200 [32];
  long local_1e0;
  ostringstream ostr;
  _Self local_68 [3];
  undefined1 local_50 [32];
  _Self local_30;
  const_iterator optIt;
  char (*def_val_local) [2];
  string *name_local;
  parser *this_local;
  
  optIt._M_node = (_Base_ptr)def_val;
  trim_leading_dashes((parser *)local_50,(string *)this);
  local_30._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->params_,(key_type *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->params_);
  bVar1 = std::operator!=(local_68,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_30);
    stringstream_proxy::stringstream_proxy(__return_storage_ptr__,&ppVar2->second);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e0);
    std::ios_base::precision((ios_base *)((long)&local_1e0 + *(long *)(local_1e0 + -0x18)),0x15);
    std::operator<<((ostream *)&local_1e0,(char *)optIt._M_node);
    std::__cxx11::ostringstream::str();
    stringstream_proxy::stringstream_proxy(__return_storage_ptr__,local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e0);
  }
  return __return_storage_ptr__;
}

Assistant:

string_stream parser::operator()(std::string const& name, T&& def_val) const
   {
      auto optIt = params_.find(trim_leading_dashes(name));
      if (params_.end() != optIt)
         return string_stream(optIt->second);

      std::ostringstream ostr;
      ostr.precision(std::numeric_limits<long double>::max_digits10);
      ostr << def_val;
      return string_stream(ostr.str()); // use default
   }